

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeFinishMoveto(VdbeCursor *p)

{
  int iVar1;
  int res;
  int local_c;
  
  iVar1 = sqlite3BtreeTableMoveto((p->uc).pCursor,p->movetoTarget,0,&local_c);
  if (iVar1 == 0) {
    if (local_c != 0) {
      iVar1 = sqlite3CorruptError(0x155ae);
      return iVar1;
    }
    p->deferredMoveto = '\0';
    p->cacheStatus = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

SQLITE_NOINLINE sqlite3VdbeFinishMoveto(VdbeCursor *p){
  int res, rc;
#ifdef SQLITE_TEST
  extern int sqlite3_search_count;
#endif
  assert( p->deferredMoveto );
  assert( p->isTable );
  assert( p->eCurType==CURTYPE_BTREE );
  rc = sqlite3BtreeTableMoveto(p->uc.pCursor, p->movetoTarget, 0, &res);
  if( rc ) return rc;
  if( res!=0 ) return SQLITE_CORRUPT_BKPT;
#ifdef SQLITE_TEST
  sqlite3_search_count++;
#endif
  p->deferredMoveto = 0;
  p->cacheStatus = CACHE_STALE;
  return SQLITE_OK;
}